

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

void Omega_h::print_set(set<int,_std::less<int>,_std::allocator<int>_> *set,Grammar *grammar)

{
  bool bVar1;
  reference piVar2;
  const_reference __lhs;
  value_type *symb_name;
  iterator iStack_30;
  int symb;
  _Self local_28;
  _Self local_20;
  iterator it;
  Grammar *grammar_local;
  set<int,_std::less<int>,_std::allocator<int>_> *set_local;
  
  it._M_node = (_Base_ptr)grammar;
  std::operator<<((ostream *)&std::cerr,"{");
  local_20._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(set);
  while( true ) {
    local_28._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(set);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    iStack_30 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(set);
    bVar1 = std::operator!=(&local_20,&stack0xffffffffffffffd0);
    if (bVar1) {
      std::operator<<((ostream *)&std::cerr,", ");
    }
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&local_20);
    if (*piVar2 == -0x1a9) {
      std::operator<<((ostream *)&std::cerr,"null");
    }
    else {
      __lhs = at<std::__cxx11::string>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(it._M_node + 1),*piVar2);
      bVar1 = std::operator==(__lhs,",");
      if (bVar1) {
        std::operator<<((ostream *)&std::cerr,"\',\'");
      }
      else {
        std::operator<<((ostream *)&std::cerr,(string *)__lhs);
      }
    }
    std::_Rb_tree_const_iterator<int>::operator++(&local_20);
  }
  std::operator<<((ostream *)&std::cerr,"}");
  return;
}

Assistant:

static void print_set(std::set<int> const& set, Grammar const& grammar) {
  std::cerr << "{";
  for (auto it = set.begin(); it != set.end(); ++it) {
    if (it != set.begin()) std::cerr << ", ";
    auto symb = *it;
    if (symb == FIRST_NULL)
      std::cerr << "null";
    else {
      auto& symb_name = at(grammar.symbol_names, symb);
      if (symb_name == ",")
        std::cerr << "','";
      else
        std::cerr << symb_name;
    }
  }
  std::cerr << "}";
}